

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.h
# Opt level: O1

char * __thiscall
Database::query(Database *this,char mktsegmentCondition,uint16_t orderdateCondition,
               uint16_t shipdateCondition,uint16_t topn)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  ushort uVar4;
  int i;
  int iVar5;
  uint uVar6;
  long lVar7;
  char *pcVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  MaxHeap heap;
  MaxHeap local_70;
  ushort *local_50;
  uint32_t *local_48;
  uint32_t *local_40;
  uint32_t *local_38;
  
  lVar7 = 0;
  do {
    if ("BAHMF"[lVar7] == mktsegmentCondition) goto LAB_00104932;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 5);
  lVar7 = 5;
LAB_00104932:
  iVar5 = (int)lVar7;
  uVar2 = *this->a_orderkey[iVar5];
  MaxHeap::MaxHeap(&local_70,topn);
  if (uVar2 != 0) {
    local_38 = this->a_extendedpricesum[iVar5];
    local_40 = this->l_orderkey;
    local_48 = local_70.c1Result;
    local_50 = local_70.c2Result;
    uVar15 = 1;
    do {
      uVar6 = local_38[uVar15];
      if (uVar6 <= *local_70.c3Result) break;
      uVar4 = this->a_orderdate[iVar5][uVar15];
      if (uVar4 < orderdateCondition) {
        if (shipdateCondition < this->a_minshipdate[iVar5][uVar15]) {
          *local_70.c1Result = this->a_orderkey[iVar5][uVar15];
          *local_70.c2Result = uVar4;
          *local_70.c3Result = uVar6;
          if ((local_70.size != 0) && (local_70.size != 1)) {
            iVar11 = 0;
            iVar10 = 1;
            iVar14 = 0;
            do {
              iVar11 = iVar11 + 2;
              iVar9 = iVar10;
              if ((iVar11 < (int)(uint)local_70.size) &&
                 (iVar9 = iVar11, local_70.c3Result[iVar10] <= local_70.c3Result[iVar11])) {
                iVar9 = iVar10;
              }
              if (local_70.c3Result[iVar14] <= local_70.c3Result[iVar9]) break;
              uVar6 = local_70.c1Result[iVar14];
              uVar3 = local_70.c1Result[iVar9];
              local_70.c1Result[iVar14] = uVar6 ^ uVar3;
              uVar6 = uVar6 ^ uVar3 ^ local_70.c1Result[iVar9];
              local_70.c1Result[iVar9] = uVar6;
              local_70.c1Result[iVar14] = local_70.c1Result[iVar14] ^ uVar6;
              uVar4 = local_70.c2Result[iVar14];
              uVar1 = local_70.c2Result[iVar9];
              local_70.c2Result[iVar14] = uVar4 ^ uVar1;
              uVar4 = uVar4 ^ uVar1 ^ local_70.c2Result[iVar9];
              local_70.c2Result[iVar9] = uVar4;
              local_70.c2Result[iVar14] = local_70.c2Result[iVar14] ^ uVar4;
              uVar6 = local_70.c3Result[iVar14];
              uVar3 = local_70.c3Result[iVar9];
              local_70.c3Result[iVar14] = uVar6 ^ uVar3;
              uVar6 = uVar6 ^ uVar3 ^ local_70.c3Result[iVar9];
              local_70.c3Result[iVar9] = uVar6;
              local_70.c3Result[iVar14] = local_70.c3Result[iVar14] ^ uVar6;
              iVar11 = iVar9 * 2;
              iVar10 = iVar9 * 2 + 1;
              iVar14 = iVar9;
            } while (iVar10 < (int)(uint)local_70.size);
          }
        }
        else if (shipdateCondition < this->a_maxshipdate[iVar5][uVar15]) {
          uVar6 = 0;
          if (this->a_lineitemposition[iVar5][uVar15] >> 1 < 0x59686629) {
            uVar6 = 0;
            uVar13 = (ulong)this->a_lineitemposition[iVar5][uVar15];
            do {
              uVar12 = uVar13 + 1;
              if (local_40[uVar13] != this->a_orderkey[iVar5][uVar15]) break;
              if (shipdateCondition < this->l_shipdate[uVar13]) {
                uVar6 = uVar6 + this->l_extendedprice[uVar13];
              }
              uVar13 = uVar12;
            } while ((int)uVar12 != -0x4d2f33ae);
          }
          if (*local_70.c3Result < uVar6) {
            *local_70.c1Result = this->a_orderkey[iVar5][uVar15];
            *local_70.c2Result = uVar4;
            *local_70.c3Result = uVar6;
            if ((local_70.size != 0) && (local_70.size != 1)) {
              iVar11 = 0;
              iVar10 = 1;
              iVar14 = 0;
              do {
                iVar11 = iVar11 + 2;
                iVar9 = iVar10;
                if ((iVar11 < (int)(uint)local_70.size) &&
                   (iVar9 = iVar11, local_70.c3Result[iVar10] <= local_70.c3Result[iVar11])) {
                  iVar9 = iVar10;
                }
                if (local_70.c3Result[iVar14] <= local_70.c3Result[iVar9]) break;
                uVar6 = local_70.c1Result[iVar14];
                uVar3 = local_70.c1Result[iVar9];
                local_70.c1Result[iVar14] = uVar6 ^ uVar3;
                uVar6 = uVar6 ^ uVar3 ^ local_70.c1Result[iVar9];
                local_70.c1Result[iVar9] = uVar6;
                local_70.c1Result[iVar14] = local_70.c1Result[iVar14] ^ uVar6;
                uVar4 = local_70.c2Result[iVar14];
                uVar1 = local_70.c2Result[iVar9];
                local_70.c2Result[iVar14] = uVar4 ^ uVar1;
                uVar4 = uVar4 ^ uVar1 ^ local_70.c2Result[iVar9];
                local_70.c2Result[iVar9] = uVar4;
                local_70.c2Result[iVar14] = local_70.c2Result[iVar14] ^ uVar4;
                uVar6 = local_70.c3Result[iVar14];
                uVar3 = local_70.c3Result[iVar9];
                local_70.c3Result[iVar14] = uVar6 ^ uVar3;
                uVar6 = uVar6 ^ uVar3 ^ local_70.c3Result[iVar9];
                local_70.c3Result[iVar9] = uVar6;
                local_70.c3Result[iVar14] = local_70.c3Result[iVar14] ^ uVar6;
                iVar11 = iVar9 * 2;
                iVar10 = iVar9 * 2 + 1;
                iVar14 = iVar9;
              } while (iVar10 < (int)(uint)local_70.size);
            }
          }
        }
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 <= uVar2);
  }
  pcVar8 = MaxHeap::getResults(&local_70);
  MaxHeap::~MaxHeap(&local_70);
  return pcVar8;
}

Assistant:

inline char* query(char mktsegmentCondition, uint16_t orderdateCondition, uint16_t shipdateCondition, uint16_t topn) {
    auto p = util::get_key_index(mktsegmentCondition);
    auto A_LENGTH = a_orderkey[p][0];
    MaxHeap heap(topn);
    for (uint32_t pos = 1; pos <= A_LENGTH; ++pos) {
      if (a_extendedpricesum[p][pos] <= heap.top()) {  // early stop
        break;
      }
      if (a_orderdate[p][pos] < orderdateCondition) {
        if (a_minshipdate[p][pos] > shipdateCondition) {
          heap.insert(a_orderkey[p][pos], a_orderdate[p][pos], a_extendedpricesum[p][pos]);
        } else if (a_maxshipdate[p][pos] > shipdateCondition) { // lookup lineitem table
          uint32_t l_position = a_lineitemposition[p][pos];
          uint32_t joinkey = a_orderkey[p][pos];
          uint32_t eps = 0;
          while (l_position < LINEITEM && l_orderkey[l_position] == joinkey) {
            if (l_shipdate[l_position] > shipdateCondition) {
              eps += l_extendedprice[l_position];
            }
            ++l_position;
          }
          heap.insert(a_orderkey[p][pos], a_orderdate[p][pos], eps);
        }
      }
    }
    return heap.getResults();
  }